

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotScatterEx<ImPlot::GetterYs<unsigned_short>>
               (char *label_id,GetterYs<unsigned_short> *getter)

{
  float fVar1;
  float fVar2;
  double dVar3;
  ImVec2 IVar4;
  undefined8 uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar12;
  unsigned_short *puVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  ImPlotRange *pIVar19;
  ImPlotContext *pIVar20;
  undefined1 auVar21 [16];
  bool bVar22;
  uint uVar23;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  ImPlotContext *pIVar24;
  double dVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  unsigned_short *puVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 local_98;
  ImDrawList *local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_5c;
  double local_58;
  undefined8 uStack_50;
  unsigned_short *local_48;
  double dStack_40;
  
  bVar22 = BeginItem(label_id,2);
  pIVar24 = GImPlot;
  if (bVar22) {
    if ((GImPlot->FitThisFrame == true) && (iVar8 = getter->Count, 0 < iVar8)) {
      dVar3 = getter->X0;
      dVar25 = getter->XScale;
      puVar35 = getter->Ys;
      iVar28 = getter->Offset;
      iVar9 = getter->Stride;
      pIVar12 = GImPlot->CurrentPlot;
      iVar29 = pIVar12->CurrentYAxis;
      uVar10 = (pIVar12->XAxis).Flags;
      pIVar19 = GImPlot->ExtentsY;
      uVar11 = pIVar12->YAxis[iVar29].Flags;
      iVar27 = 0;
      uVar26 = uVar11 & 0x20;
      uVar23 = uVar26 >> 5;
      local_88._0_4_ = uVar23;
      auVar21 = local_88;
      local_78 = (unsigned_short *)(CONCAT44(local_78._4_4_,uVar10) & 0xffffffff00000020);
      dVar14 = 0.0;
      do {
        dVar38 = dVar25 * dVar14 + dVar3;
        uVar7 = *(ushort *)
                 ((long)puVar35 + (long)(((iVar28 + iVar27) % iVar8 + iVar8) % iVar8) * (long)iVar9)
        ;
        dVar16 = (double)uVar7;
        if ((uVar10 >> 10 & 1) == 0) {
          if ((long)ABS(dVar38) < 0x7ff0000000000000) {
LAB_001ce643:
            if ((0.0 < dVar38) || ((int)local_78 == 0)) {
              dVar17 = (pIVar24->ExtentsX).Min;
              dVar18 = (pIVar24->ExtentsX).Max;
              uVar30 = -(ulong)(dVar38 < dVar17);
              uVar31 = -(ulong)(dVar18 < dVar38);
              auVar39._0_8_ = (ulong)dVar38 & uVar30;
              auVar39._8_8_ = (ulong)dVar38 & uVar31;
              auVar41._0_8_ = ~uVar30 & (ulong)dVar17;
              auVar41._8_8_ = ~uVar31 & (ulong)dVar18;
              pIVar24->ExtentsX = (ImPlotRange)(auVar41 | auVar39);
            }
          }
        }
        else if ((((long)ABS(dVar38) < 0x7ff0000000000000) &&
                 (pIVar12->YAxis[iVar29].Range.Min <= dVar16)) &&
                (dVar16 <= pIVar12->YAxis[iVar29].Range.Max)) goto LAB_001ce643;
        if ((uVar11 >> 10 & 1) == 0) {
          if ((uVar7 != 0) || (uVar26 == 0)) {
LAB_001ce6cd:
            dVar38 = pIVar19[iVar29].Min;
            dVar17 = pIVar24->ExtentsY[iVar29].Max;
            uVar31 = -(ulong)(dVar16 < dVar38);
            uVar32 = -(ulong)(dVar17 < dVar16);
            uVar30 = (ulong)dVar16 & uVar32;
            auVar40._0_8_ = ~uVar31 & (ulong)dVar38;
            auVar40._8_8_ = ~uVar32 & (ulong)dVar17;
            auVar15._8_4_ = (int)uVar30;
            auVar15._0_8_ = (ulong)dVar16 & uVar31;
            auVar15._12_4_ = (int)(uVar30 >> 0x20);
            pIVar19[iVar29] = (ImPlotRange)(auVar40 | auVar15);
          }
        }
        else if ((((pIVar12->XAxis).Range.Min <= dVar38) && (dVar38 <= (pIVar12->XAxis).Range.Max))
                && (local_88[0] = (byte)uVar23, (uVar7 == 0 & local_88[0]) == 0)) goto LAB_001ce6cd;
        dVar14 = dVar14 + 1.0;
        iVar27 = iVar27 + 1;
        local_88 = auVar21;
      } while (iVar8 != iVar27);
    }
    local_90 = GetPlotDrawList();
    iVar8 = (pIVar24->NextItemData).Marker;
    iVar28 = 0;
    if (iVar8 != -1) {
      iVar28 = iVar8;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar24->NextItemData).MarkerSize);
    col_mk_line = ImGui::GetColorU32((pIVar24->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar24->NextItemData).Colors + 3);
    pIVar20 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar8 = getter->Count;
      if (0 < iVar8) {
        puVar13 = getter->Ys;
        puVar35 = (unsigned_short *)getter->XScale;
        local_48 = (unsigned_short *)getter->X0;
        uVar36 = SUB84(local_48,0);
        uVar37 = (undefined4)((ulong)local_48 >> 0x20);
        dVar25 = (double)(ulong)(uint)getter->Offset;
        fVar1 = (pIVar24->NextItemData).MarkerSize;
        fVar2 = (pIVar24->NextItemData).MarkerWeight;
        iVar9 = getter->Stride;
        iVar29 = 0;
        dVar3 = 0.0;
        bVar22 = (pIVar24->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar24->NextItemData).RenderMarkerFill;
        pIVar24 = GImPlot;
        local_78 = puVar35;
        local_58 = dVar25;
        do {
          IVar4 = pIVar24->PixelRange[transformer.YAxis].Min;
          fVar33 = (float)(pIVar24->Mx *
                           (((double)puVar35 * dVar3 + (double)CONCAT44(uVar37,uVar36)) -
                           (pIVar24->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
          fVar34 = (float)(pIVar24->My[transformer.YAxis] *
                           ((double)*(ushort *)
                                     ((long)puVar13 +
                                     (long)(((SUB84(dVar25,0) + iVar29) % iVar8 + iVar8) % iVar8) *
                                     (long)iVar9) -
                           pIVar24->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_98 = CONCAT44(fVar34,fVar33);
          pIVar12 = pIVar20->CurrentPlot;
          if ((((pIVar12->PlotRect).Min.x <= fVar33) && ((pIVar12->PlotRect).Min.y <= fVar34)) &&
             ((fVar33 < (pIVar12->PlotRect).Max.x && (fVar34 < (pIVar12->PlotRect).Max.y)))) {
            local_88._0_8_ = dVar3;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar22,col_mk_line,bVar6,col_mk_fill);
            uVar36 = SUB84(local_48,0);
            uVar37 = (undefined4)((ulong)local_48 >> 0x20);
            pIVar24 = GImPlot;
            dVar25 = local_58;
            puVar35 = local_78;
            dVar3 = (double)local_88._0_8_;
          }
          dVar3 = dVar3 + 1.0;
          iVar29 = iVar29 + 1;
        } while (iVar8 != iVar29);
      }
      break;
    case 1:
      iVar8 = getter->Count;
      if (0 < iVar8) {
        local_48 = getter->Ys;
        local_58 = getter->XScale;
        dVar3 = getter->X0;
        iVar9 = getter->Offset;
        fVar1 = (pIVar24->NextItemData).MarkerSize;
        fVar2 = (pIVar24->NextItemData).MarkerWeight;
        iVar29 = getter->Stride;
        iVar27 = 0;
        dVar25 = 0.0;
        bVar22 = (pIVar24->NextItemData).RenderMarkerLine;
        local_5c = (uint)(pIVar24->NextItemData).RenderMarkerFill;
        do {
          pIVar24 = GImPlot;
          local_88._0_8_ = dVar25;
          local_78 = (unsigned_short *)
                     (double)*(ushort *)
                              ((long)local_48 +
                              (long)(((iVar9 + iVar27) % iVar8 + iVar8) % iVar8) * (long)iVar29);
          uStack_70 = 0;
          dVar25 = log10((local_58 * dVar25 + dVar3) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar12 = pIVar24->CurrentPlot;
          dVar14 = (pIVar12->XAxis).Range.Min;
          IVar4 = pIVar24->PixelRange[transformer.YAxis].Min;
          fVar33 = (float)(pIVar24->Mx *
                           (((double)(float)(dVar25 / pIVar24->LogDenX) *
                             ((pIVar12->XAxis).Range.Max - dVar14) + dVar14) - dVar14) +
                          (double)IVar4.x);
          fVar34 = (float)(pIVar24->My[transformer.YAxis] *
                           ((double)local_78 - pIVar12->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_98 = CONCAT44(fVar34,fVar33);
          pIVar12 = pIVar20->CurrentPlot;
          if ((((pIVar12->PlotRect).Min.x <= fVar33) && ((pIVar12->PlotRect).Min.y <= fVar34)) &&
             ((fVar33 < (pIVar12->PlotRect).Max.x && (fVar34 < (pIVar12->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar22,col_mk_line,local_5c,col_mk_fill);
          }
          dVar25 = (double)local_88._0_8_ + 1.0;
          iVar27 = iVar27 + 1;
        } while (iVar8 != iVar27);
      }
      break;
    case 2:
      iVar8 = getter->Count;
      if (0 < iVar8) {
        local_78 = getter->Ys;
        local_48 = (unsigned_short *)getter->XScale;
        dStack_40 = getter->X0;
        local_58 = getter->X0;
        uStack_50._0_4_ = getter->Offset;
        uStack_50._4_4_ = getter->Stride;
        iVar9 = getter->Offset;
        fVar1 = (pIVar24->NextItemData).MarkerSize;
        fVar2 = (pIVar24->NextItemData).MarkerWeight;
        iVar29 = getter->Stride;
        iVar27 = 0;
        dVar3 = 0.0;
        local_88._8_4_ = 0;
        local_88._12_4_ = 0;
        bVar22 = (pIVar24->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar24->NextItemData).RenderMarkerFill;
        do {
          pIVar24 = GImPlot;
          local_88._0_8_ = dVar3;
          dVar25 = log10((double)*(ushort *)
                                  ((long)local_78 +
                                  (long)(((iVar9 + iVar27) % iVar8 + iVar8) % iVar8) * (long)iVar29)
                         / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar12 = pIVar24->CurrentPlot;
          dVar3 = pIVar12->YAxis[transformer.YAxis].Range.Min;
          IVar4 = pIVar24->PixelRange[transformer.YAxis].Min;
          fVar33 = (float)(pIVar24->Mx *
                           ((local_58 + local_88._0_8_ * (double)local_48) -
                           (pIVar12->XAxis).Range.Min) + (double)IVar4.x);
          fVar34 = (float)(pIVar24->My[transformer.YAxis] *
                           ((dVar3 + (double)(float)(dVar25 / pIVar24->LogDenY[transformer.YAxis]) *
                                     (pIVar12->YAxis[transformer.YAxis].Range.Max - dVar3)) - dVar3)
                          + (double)IVar4.y);
          local_98 = CONCAT44(fVar34,fVar33);
          pIVar12 = pIVar20->CurrentPlot;
          if (((((pIVar12->PlotRect).Min.x <= fVar33) &&
               (uVar5 = *(undefined8 *)&(pIVar12->PlotRect).Min.y, (float)uVar5 <= fVar34)) &&
              (fVar33 < (float)((ulong)uVar5 >> 0x20))) && (fVar34 < (pIVar12->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar22,col_mk_line,bVar6,col_mk_fill);
          }
          dVar3 = (double)CONCAT44(local_88._4_4_,local_88._0_4_) + 1.0;
          iVar27 = iVar27 + 1;
        } while (iVar8 != iVar27);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_short>>
                (*getter,transformer,local_90,iVar28,(pIVar24->NextItemData).MarkerSize,
                 (pIVar24->NextItemData).RenderMarkerLine,col_mk_line,
                 (pIVar24->NextItemData).MarkerWeight,(pIVar24->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar24 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar24->NextItemData);
    pIVar24->PreviousItem = pIVar24->CurrentItem;
    pIVar24->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}